

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAcesFile.cpp
# Opt level: O3

void __thiscall
Imf_2_5::AcesOutputFile::AcesOutputFile
          (AcesOutputFile *this,OStream *os,Header *header,RgbaChannels rgbaChannels,int numThreads)

{
  Data *this_00;
  Compression *pCVar1;
  RgbaOutputFile *this_01;
  Header newHeader;
  Header HStack_68;
  
  this->_vptr_AcesOutputFile = (_func_int **)&PTR__AcesOutputFile_0049db18;
  this_00 = (Data *)operator_new(8);
  Data::Data(this_00);
  this->_data = this_00;
  pCVar1 = Header::compression(header);
  anon_unknown_14::checkCompression(*pCVar1);
  Header::Header(&HStack_68,header);
  acesChromaticities();
  addChromaticities(&HStack_68,&acesChromaticities::acesChr);
  acesChromaticities();
  addAdoptedNeutral(&HStack_68,&acesChromaticities::acesChr.white);
  this_01 = (RgbaOutputFile *)operator_new(0x18);
  RgbaOutputFile::RgbaOutputFile(this_01,os,header,rgbaChannels,numThreads);
  this->_data->rgbaFile = this_01;
  RgbaOutputFile::setYCRounding(this_01,7,6);
  Header::~Header(&HStack_68);
  return;
}

Assistant:

AcesOutputFile::AcesOutputFile
    (OPENEXR_IMF_INTERNAL_NAMESPACE::OStream &os,
     const Header &header,
     RgbaChannels rgbaChannels,
     int numThreads)
:
    _data (new Data)
{
    checkCompression (header.compression());

    Header newHeader = header;
    addChromaticities (newHeader, acesChromaticities());
    addAdoptedNeutral (newHeader, acesChromaticities().white);

    _data->rgbaFile = new RgbaOutputFile (os,
					  header,
					  rgbaChannels,
					  numThreads);

    _data->rgbaFile->setYCRounding (7, 6);
}